

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

Cnf_Dat_t * Mf_ManDeriveCnf(Mf_Man_t *p,int fCnfObjIds,int fAddOrCla)

{
  long lVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar4;
  Cnf_Dat_t *pCVar5;
  int **ppiVar6;
  int *piVar7;
  uint *puVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  Gia_Man_t *pGVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  byte bVar17;
  int Entry;
  int **ppiVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  long local_f0;
  int nLits;
  int nClas;
  Cnf_Dat_t *local_d0;
  long local_c8;
  int **local_c0;
  ulong local_b8;
  int local_ac;
  Vec_Int_t *local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  long local_88;
  int nVars;
  int pFanins [16];
  
  local_a8 = Mf_ManDeriveCnfs(p,&nVars,&nClas,&nLits);
  p_01 = Vec_IntStartFull(p->pGia->nObjs);
  iVar2 = nVars;
  piVar9 = p_01->pArray;
  iVar3 = nVars + 1;
  if (fAddOrCla != 0) {
    nClas = nClas + 1;
    nLits = nLits + p->pGia->vCos->nSize;
  }
  local_ac = fCnfObjIds;
  nVars = iVar3;
  if (fCnfObjIds == 0) {
    iVar10 = 2;
    do {
      pGVar13 = p->pGia;
      if (pGVar13->vCos->nSize <= iVar10 + -2) {
LAB_005c5f37:
        iVar15 = pGVar13->nObjs;
        Entry = iVar10 + -1;
        do {
          uVar19 = (ulong)(iVar15 - 1) << 4 | 0xc;
          iVar11 = iVar15;
          while( true ) {
            iVar15 = iVar15 + -1;
            if (iVar11 < 2) {
              iVar15 = 0;
              Vec_IntWriteEntry(p_01,0,Entry);
              goto LAB_005c5fc4;
            }
            iVar11 = iVar11 + -1;
            pGVar4 = Gia_ManObj(p->pGia,iVar11);
            if ((-1 < (int)*(uint *)pGVar4 && (~*(uint *)pGVar4 & 0x1fffffff) != 0) &&
               (0xffff < *(uint *)((long)&p->pLfObjs->iCutSet + uVar19))) break;
            uVar19 = uVar19 - 0x10;
          }
          Vec_IntWriteEntry(p_01,iVar11,Entry);
          iVar10 = iVar10 + 1;
          Entry = Entry + 1;
        } while( true );
      }
      pGVar4 = Gia_ManCo(pGVar13,iVar10 + -2);
      iVar15 = Gia_ObjId(pGVar13,pGVar4);
      if (iVar15 == 0) {
        pGVar13 = p->pGia;
        goto LAB_005c5f37;
      }
      Vec_IntWriteEntry(p_01,iVar15,iVar10 + -1);
      iVar10 = iVar10 + 1;
    } while( true );
  }
  pGVar13 = p->pGia;
  iVar2 = pGVar13->vCos->nSize;
  iVar15 = pGVar13->vCis->nSize + iVar2 + 2;
  iVar10 = 0;
  do {
    if (iVar2 <= iVar10) {
LAB_005c5e57:
      iVar2 = pGVar13->nObjs;
      do {
        uVar19 = (ulong)(iVar2 - 1) << 4 | 0xc;
        iVar10 = iVar2;
        while( true ) {
          iVar2 = iVar2 + -1;
          if (iVar10 < 2) {
            iVar2 = 0;
            Vec_IntWriteEntry(p_01,0,0);
            goto LAB_005c5ed0;
          }
          iVar10 = iVar10 + -1;
          pGVar4 = Gia_ManObj(p->pGia,iVar10);
          if ((-1 < (int)*(uint *)pGVar4 && (~*(uint *)pGVar4 & 0x1fffffff) != 0) &&
             (0xffff < *(uint *)((long)&p->pLfObjs->iCutSet + uVar19))) break;
          uVar19 = uVar19 - 0x10;
        }
        Vec_IntWriteEntry(p_01,iVar10,iVar10);
        iVar15 = iVar15 + 1;
      } while( true );
    }
    pGVar4 = Gia_ManCo(pGVar13,iVar10);
    iVar2 = Gia_ObjId(pGVar13,pGVar4);
    if (iVar2 == 0) {
      pGVar13 = p->pGia;
      goto LAB_005c5e57;
    }
    Vec_IntWriteEntry(p_01,iVar2,iVar2);
    iVar10 = iVar10 + 1;
    pGVar13 = p->pGia;
    iVar2 = pGVar13->vCos->nSize;
  } while( true );
LAB_005c5fc4:
  pGVar13 = p->pGia;
  if (pGVar13->vCis->nSize <= iVar15) goto LAB_005c6005;
  pGVar4 = Gia_ManCi(pGVar13,iVar15);
  iVar11 = Gia_ObjId(pGVar13,pGVar4);
  if (iVar11 == 0) goto LAB_005c6005;
  Vec_IntWriteEntry(p_01,iVar11,iVar10);
  iVar15 = iVar15 + 1;
  iVar10 = iVar10 + 1;
  goto LAB_005c5fc4;
LAB_005c6005:
  if ((Entry - iVar2) + iVar15 != 0) {
    __assert_fail("iVar == nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                  ,0x16c,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
  }
  goto LAB_005c6016;
LAB_005c5ed0:
  pGVar13 = p->pGia;
  if (pGVar13->vCis->nSize <= iVar2) goto LAB_005c5f06;
  pGVar4 = Gia_ManCi(pGVar13,iVar2);
  iVar10 = Gia_ObjId(pGVar13,pGVar4);
  if (iVar10 == 0) goto LAB_005c5f06;
  Vec_IntWriteEntry(p_01,iVar10,iVar10);
  iVar2 = iVar2 + 1;
  goto LAB_005c5ed0;
LAB_005c5f06:
  if (iVar15 != iVar3) {
    __assert_fail("iVar == nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                  ,0x160,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
  }
LAB_005c6016:
  pCVar5 = (Cnf_Dat_t *)calloc(1,0x48);
  pGVar13 = p->pGia;
  pCVar5->pMan = (Aig_Man_t *)pGVar13;
  pCVar5->nVars = iVar3;
  lVar16 = (long)nLits;
  pCVar5->nLiterals = nLits;
  uVar20 = (ulong)nClas;
  pCVar5->nClauses = nClas;
  ppiVar6 = (int **)malloc(uVar20 * 8 + 8);
  pCVar5->pClauses = ppiVar6;
  local_d0 = pCVar5;
  local_98 = lVar16;
  piVar7 = (int *)malloc(lVar16 * 4);
  uVar19 = 0;
  *ppiVar6 = piVar7;
  local_a0 = uVar20;
  if (fAddOrCla == 0) {
    uVar20 = 0;
    local_f0 = 0;
  }
  else {
    for (uVar20 = 0; (int)uVar20 < pGVar13->vCos->nSize; uVar20 = uVar20 + 1) {
      pGVar4 = Gia_ManCo(pGVar13,(int)uVar20);
      iVar3 = Gia_ObjId(pGVar13,pGVar4);
      if (iVar3 == 0) break;
      iVar3 = Abc_Var2Lit(piVar9[iVar3],0);
      (*ppiVar6)[uVar20] = iVar3;
      pGVar13 = p->pGia;
    }
    uVar20 = uVar20 & 0xffffffff;
    local_f0 = 1;
  }
  local_c0 = ppiVar6 + local_f0 + 1;
  local_c8 = uVar20 << 2;
  lVar16 = 0;
  while( true ) {
    pGVar13 = p->pGia;
    if (pGVar13->vCos->nSize <= (int)uVar19) break;
    pGVar4 = Gia_ManCo(pGVar13,(int)uVar19);
    pGVar13 = p->pGia;
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ObjId(pGVar13,pGVar4);
    lVar1 = local_c8;
    uVar12 = *(uint *)pGVar4;
    *(long *)((long)local_c0 + lVar16 + -8) = (long)*ppiVar6 + lVar16 + local_c8;
    local_88 = (long)iVar3;
    local_b8 = uVar19;
    iVar2 = Abc_Var2Lit(piVar9[local_88],0);
    *(int *)((long)*ppiVar6 + lVar16 + lVar1) = iVar2;
    local_90 = (long)(int)(iVar3 - (uVar12 & 0x1fffffff));
    iVar3 = Abc_Var2Lit(piVar9[local_90],(uint)((*(uint *)pGVar4 >> 0x1d & 1) == 0));
    lVar1 = local_c8;
    piVar7 = *ppiVar6;
    *(int *)((long)piVar7 + lVar16 + local_c8 + 4) = iVar3;
    local_f0 = local_f0 + 2;
    *(long *)((long)local_c0 + lVar16) = (long)piVar7 + lVar16 + local_c8 + 8;
    iVar3 = Abc_Var2Lit(piVar9[local_88],1);
    uVar19 = local_b8;
    *(int *)((long)*ppiVar6 + lVar16 + 8 + lVar1) = iVar3;
    iVar3 = Abc_Var2Lit(piVar9[local_90],*(uint *)pGVar4 >> 0x1d & 1);
    *(int *)((long)*ppiVar6 + lVar16 + 0xc + lVar1) = iVar3;
    uVar19 = (ulong)((int)uVar19 + 1);
    lVar16 = lVar16 + 0x10;
    uVar20 = (ulong)((int)uVar20 + 4);
  }
  uVar19 = (ulong)(uint)pGVar13->nObjs;
  do {
    uVar14 = uVar19 & 0xffffffff;
    lVar16 = (ulong)((int)uVar19 - 1) << 2;
    while( true ) {
      uVar19 = uVar19 - 1;
      iVar3 = (int)local_f0;
      if ((int)uVar14 < 2) {
        iVar10 = (int)uVar20;
        ppiVar6[iVar3] = *ppiVar6 + iVar10;
        iVar2 = Abc_Var2Lit(*piVar9,1);
        uVar19 = local_a0;
        piVar7 = *ppiVar6;
        piVar7[iVar10] = iVar2;
        iVar2 = (int)local_a0;
        if (iVar3 + 1 != (int)local_a0) {
          __assert_fail("iCla == nClas",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                        ,0x1a8,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
        }
        if (iVar10 + 1 != (int)local_98) {
          __assert_fail("iLit == nLits",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                        ,0x1a9,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
        }
        ppiVar6[local_a0] = piVar7 + local_98;
        Vec_IntFree(local_a8);
        if (local_ac != 0) {
          sVar21 = (long)p->pGia->nObjs << 2;
          piVar9 = (int *)malloc(sVar21);
          memset(piVar9,0xff,sVar21);
          pCVar5 = local_d0;
          local_d0->pObj2Clause = piVar9;
          piVar7 = (int *)malloc(sVar21);
          memset(piVar7,0xff,sVar21);
          pCVar5->pObj2Count = piVar7;
          uVar20 = 0;
          uVar19 = uVar19 & 0xffffffff;
          if (iVar2 < 1) {
            uVar19 = uVar20;
          }
          for (; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            uVar12 = Abc_Lit2Var(*ppiVar6[uVar20]);
            if (piVar9[uVar12] == -1) {
              piVar9[uVar12] = (int)uVar20;
              piVar7[uVar12] = 1;
            }
            else {
              if (piVar7[uVar12] < 1) {
                __assert_fail("pCnf->pObj2Count[Id] > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                              ,0x1bd,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
              }
              piVar7[uVar12] = piVar7[uVar12] + 1;
            }
          }
          goto LAB_005c661b;
        }
        pGVar13 = p->pGia0;
        if (p->pGia == pGVar13) {
          p_01->nCap = 0;
          p_01->nSize = 0;
          p_01->pArray = (int *)0x0;
          local_d0->pVarNums = piVar9;
          goto LAB_005c661b;
        }
        sVar21 = (long)pGVar13->nObjs << 2;
        piVar7 = (int *)malloc(sVar21);
        memset(piVar7,0xff,sVar21);
        local_d0->pVarNums = piVar7;
        iVar3 = 0;
        goto LAB_005c6559;
      }
      uVar12 = (int)uVar14 - 1;
      uVar14 = (ulong)uVar12;
      pGVar4 = Gia_ManObj(p->pGia,uVar12);
      if ((-1 < (int)*(uint *)pGVar4 && (~*(uint *)pGVar4 & 0x1fffffff) != 0) &&
         (0xffff < *(uint *)(&p->pLfObjs->field_0xc + lVar16 * 4))) break;
      lVar16 = lVar16 + -4;
    }
    local_b8 = uVar19;
    piVar7 = Mf_ObjCutSet(p,uVar12);
    iVar2 = Abc_Lit2Var((uint)piVar7[1] >> 5);
    iVar10 = Abc_LitIsCompl((uint)piVar7[1] >> 5);
    p_00 = local_a8;
    local_c8 = CONCAT44(local_c8._4_4_,iVar10);
    uVar12 = piVar7[1];
    for (uVar19 = 0; (uVar12 & 0x1f) != uVar19; uVar19 = uVar19 + 1) {
      pFanins[uVar19] = piVar9[piVar7[uVar19 + 2]];
    }
    pFanins[uVar12 & 0x1f] = *(int *)((long)piVar9 + lVar16);
    iVar2 = Vec_IntEntry(local_a8,iVar2);
    puVar8 = (uint *)Vec_IntEntryP(p_00,iVar2);
    local_f0 = (long)iVar3;
    uVar12 = *puVar8;
    if ((int)*puVar8 < 1) {
      uVar12 = 0;
    }
    local_c0 = (int **)(ulong)uVar12;
    for (ppiVar18 = (int **)0x0; uVar19 = local_b8, ppiVar18 != local_c0;
        ppiVar18 = (int **)((long)ppiVar18 + 1)) {
      iVar3 = (int)uVar20;
      ppiVar6[local_f0] = *ppiVar6 + iVar3;
      uVar12 = (int)puVar8[(long)ppiVar18 + 1] >> ((char)(piVar7[1] & 0x1fU) * '\x02' & 0x1fU) & 3;
      if (uVar12 == 0) {
        __assert_fail("Mf_CubeLit(pCubes[c], k)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                      ,0x19e,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
      }
      local_f0 = local_f0 + 1;
      iVar2 = Abc_Var2Lit(pFanins[piVar7[1] & 0x1fU],uVar12 == 2 ^ (uint)local_c8);
      uVar20 = (ulong)(iVar3 + 1);
      (*ppiVar6)[iVar3] = iVar2;
      bVar17 = 0;
      for (uVar19 = 0; uVar19 < (piVar7[1] & 0x1f); uVar19 = uVar19 + 1) {
        uVar12 = (int)puVar8[(long)ppiVar18 + 1] >> (bVar17 & 0x1f) & 3;
        if (uVar12 != 0) {
          iVar3 = Abc_Var2Lit(pFanins[uVar19],(uint)(uVar12 == 2));
          iVar2 = (int)uVar20;
          uVar20 = (ulong)(iVar2 + 1);
          (*ppiVar6)[iVar2] = iVar3;
        }
        bVar17 = bVar17 + 2;
      }
    }
  } while( true );
LAB_005c6559:
  if (pGVar13->vCis->nSize <= iVar3) goto LAB_005c65af;
  pGVar4 = Gia_ManCi(pGVar13,iVar3);
  iVar2 = Gia_ObjId(pGVar13,pGVar4);
  if (iVar2 == 0) goto LAB_005c65af;
  pGVar13 = p->pGia;
  pGVar4 = Gia_ManCi(pGVar13,iVar3);
  iVar10 = Gia_ObjId(pGVar13,pGVar4);
  piVar7[iVar2] = piVar9[iVar10];
  iVar3 = iVar3 + 1;
  pGVar13 = p->pGia0;
  goto LAB_005c6559;
LAB_005c65af:
  for (iVar3 = 0; pGVar13 = p->pGia0, iVar3 < pGVar13->vCos->nSize; iVar3 = iVar3 + 1) {
    pGVar4 = Gia_ManCo(pGVar13,iVar3);
    iVar2 = Gia_ObjId(pGVar13,pGVar4);
    if (iVar2 == 0) break;
    pGVar13 = p->pGia;
    pGVar4 = Gia_ManCo(pGVar13,iVar3);
    iVar10 = Gia_ObjId(pGVar13,pGVar4);
    piVar7[iVar2] = piVar9[iVar10];
  }
LAB_005c661b:
  Vec_IntFree(p_01);
  return local_d0;
}

Assistant:

Cnf_Dat_t * Mf_ManDeriveCnf( Mf_Man_t * p, int fCnfObjIds, int fAddOrCla )
{
    Cnf_Dat_t * pCnf; 
    Gia_Obj_t * pObj;
    int Id, DriId, nVars, nClas, nLits, iVar = 1, iCla = 0, iLit = 0;
    Vec_Int_t * vCnfs = Mf_ManDeriveCnfs( p, &nVars, &nClas, &nLits );
    Vec_Int_t * vCnfIds = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    int pFanins[16], * pCut, * pCnfIds = Vec_IntArray( vCnfIds );
    int i, k, c, iFunc, nCubes, * pCubes, fComplLast;
    nVars++;  // zero-ID to remain unused
    if ( fAddOrCla )
    {
        nClas++;
        nLits += Gia_ManCoNum(p->pGia);
    }
    // create CNF IDs
    if ( fCnfObjIds )
    {
        iVar += 1 + Gia_ManCiNum(p->pGia) + Gia_ManCoNum(p->pGia);
        Gia_ManForEachCoId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, Id );
        Gia_ManForEachAndReverseId( p->pGia, Id )
            if ( Mf_ObjMapRefNum(p, Id) )
                Vec_IntWriteEntry( vCnfIds, Id, Id ), iVar++;
        Vec_IntWriteEntry( vCnfIds, 0, 0 );
        Gia_ManForEachCiId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, Id );
        assert( iVar == nVars );
    }
    else
    {
        Gia_ManForEachCoId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, iVar++ );
        Gia_ManForEachAndReverseId( p->pGia, Id )
            if ( Mf_ObjMapRefNum(p, Id) )
                Vec_IntWriteEntry( vCnfIds, Id, iVar++ );
        Vec_IntWriteEntry( vCnfIds, 0, iVar++ );
        Gia_ManForEachCiId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, iVar++ );
        assert( iVar == nVars );
    }
    // generate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan        = (Aig_Man_t *)p->pGia;
    pCnf->nVars       = nVars;
    pCnf->nLiterals   = nLits;
    pCnf->nClauses    = nClas;
    pCnf->pClauses    = ABC_ALLOC( int *, nClas+1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLits );
    // add last clause
    if ( fAddOrCla )
    {
        pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
        Gia_ManForEachCoId( p->pGia, Id, i )
            pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[Id], 0);
    }
    // add clauses for the COs
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        Id = Gia_ObjId( p->pGia, pObj );
        DriId = Gia_ObjFaninId0( pObj, Id );

        pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[Id], 0);
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[DriId], !Gia_ObjFaninC0(pObj));

        pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[Id], 1);
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[DriId], Gia_ObjFaninC0(pObj));
    }
    // add clauses for the mapping
    Gia_ManForEachAndReverseId( p->pGia, Id )
    {
        if ( !Mf_ObjMapRefNum(p, Id) )
            continue;
        pCut = Mf_ObjCutBest( p, Id );
        iFunc = Abc_Lit2Var( Mf_CutFunc(pCut) );
        //Dau_DsdPrintFromTruth( Vec_MemReadEntry(p->vTtMem, iFunc), 3 );
        fComplLast = Abc_LitIsCompl( Mf_CutFunc(pCut) );
        for ( k = 0; k < Mf_CutSize(pCut); k++ )
            pFanins[k] = pCnfIds[pCut[k+1]];
        pFanins[k++] = pCnfIds[Id];
        // get clauses
        pCubes = Vec_IntEntryP( vCnfs, Vec_IntEntry(vCnfs, iFunc) );
        nCubes = *pCubes++;
        for ( c = 0; c < nCubes; c++ )
        {
            pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
            k = Mf_CutSize(pCut);
            assert( Mf_CubeLit(pCubes[c], k) );
            pCnf->pClauses[0][iLit++] = Abc_Var2Lit( pFanins[k], (Mf_CubeLit(pCubes[c], k) == 2) ^ fComplLast );
            for ( k = 0; k < Mf_CutSize(pCut); k++ )
                if ( Mf_CubeLit(pCubes[c], k) )
                    pCnf->pClauses[0][iLit++] = Abc_Var2Lit( pFanins[k], Mf_CubeLit(pCubes[c], k) == 2 );
        }
    }
    // constant clause
    pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
    pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[0], 1);
    assert( iCla == nClas );
    assert( iLit == nLits );
    // add closing pointer
    pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
    // cleanup
    Vec_IntFree( vCnfs );
    // create mapping of objects into their clauses
    if ( fCnfObjIds )
    {
        pCnf->pObj2Clause = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
        pCnf->pObj2Count  = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
        for ( i = 0; i < pCnf->nClauses; i++ )
        {
            Id = Abc_Lit2Var(pCnf->pClauses[i][0]);
            if ( pCnf->pObj2Clause[Id] == -1 )
            {
                pCnf->pObj2Clause[Id] = i;
                pCnf->pObj2Count[Id] = 1;
            }
            else
            {
                assert( pCnf->pObj2Count[Id] > 0 );
                pCnf->pObj2Count[Id]++;
            }
        }
    }
    else
    {
        if ( p->pGia != p->pGia0 ) // diff managers - create map for CIs/COs
        {
            pCnf->pVarNums = ABC_FALLOC( int, Gia_ManObjNum(p->pGia0) );
            Gia_ManForEachCiId( p->pGia0, Id, i )
                pCnf->pVarNums[Id] = pCnfIds[Gia_ManCiIdToId(p->pGia, i)];
            Gia_ManForEachCoId( p->pGia0, Id, i )
                pCnf->pVarNums[Id] = pCnfIds[Gia_ManCoIdToId(p->pGia, i)];
/*
            // transform polarity of the internal nodes
            Gia_ManSetPhase( p->pGia );
            Gia_ManForEachCo( p->pGia, pObj, i )
                pObj->fPhase = 0;
            for ( i = 0; i < pCnf->nLiterals; i++ )
                if ( Gia_ManObj(p->pGia, Abc_Lit2Var(pCnf->pClauses[0][i]))->fPhase )
                    pCnf->pClauses[0][i] = Abc_LitNot( pCnf->pClauses[0][i] );
*/
        }
        else
            pCnf->pVarNums = Vec_IntReleaseArray(vCnfIds);
    }
    Vec_IntFree( vCnfIds );
    return pCnf;
}